

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtpaths.cpp
# Opt level: O0

QStringList * types(void)

{
  iterator __first;
  iterator __last;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar1;
  StringEnum *se;
  StringEnum *__end1;
  StringEnum *__begin1;
  StringEnum (*__range1) [23];
  QStringList *typelist;
  rvalue_ref in_stack_ffffffffffffff78;
  QStringList *data;
  QByteArrayView *in_stack_ffffffffffffff90;
  StringEnum *local_50;
  storage_type *local_30;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QString *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  data = in_RDI;
  QList<QString>::QList((QList<QString> *)0x10a1c4);
  for (local_50 = lookupTableData;
      local_50 != (StringEnum *)&void(QList<std::pair<QString,QString>>const&)::typeinfo;
      local_50 = local_50 + 1) {
    QByteArrayView::QByteArrayView<const_char_*,_true>(in_stack_ffffffffffffff90,(char **)data);
    QVar1.m_data = local_30;
    QVar1.m_size = (qsizetype)local_20;
    QString::fromLatin1(QVar1);
    QList<QString>::operator<<(in_RDI,in_stack_ffffffffffffff78);
    QString::~QString((QString *)0x10a24f);
  }
  __first = QList<QString>::begin(in_RDI);
  __last = QList<QString>::end(in_RDI);
  std::sort<QList<QString>::iterator>(__first,__last);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return data;
}

Assistant:

static QStringList types()
{
    QStringList typelist;
    for (const StringEnum &se : lookupTableData)
        typelist << QString::fromLatin1(se.stringvalue);
    std::sort(typelist.begin(), typelist.end());
    return typelist;
}